

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::MergeValidityLoop
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  long lVar1;
  void *__dest;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  SelectionVector *pSVar5;
  unsigned_long *puVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  row_t rVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  UpdateInfo *__dest_00;
  undefined1 uVar22;
  bool bVar23;
  bool result_values [2048];
  undefined1 local_2838 [2048];
  uint local_2038 [2050];
  
  FlatVector::VerifyFlatVector(base_data);
  lVar13 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  pSVar5 = update->sel;
  __dest_00 = base_info + 1;
  uVar2 = base_info->max;
  __dest = (void *)((long)&base_info[1].segment + (ulong)uVar2 * 4);
  uVar3 = update_info->max;
  lVar1 = (ulong)uVar3 * 4;
  if (count == 0) {
    uVar12 = (ulong)update_info->N;
    sVar15 = 0;
    uVar16 = 0;
  }
  else {
    puVar6 = (base_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    psVar7 = sel->sel_vector;
    uVar12 = (ulong)update_info->N;
    uVar17 = (ulong)base_info->N;
    uVar18 = 0;
    uVar16 = 0;
    uVar20 = 0;
    sVar15 = 0;
    do {
      uVar21 = uVar20;
      if (psVar7 != (sel_t *)0x0) {
        uVar21 = (ulong)psVar7[uVar20];
      }
      uVar21 = ids[uVar21] - lVar13;
      sVar14 = sVar15;
      if (uVar16 < uVar12) {
        lVar10 = 0;
        do {
          uVar4 = *(uint *)((long)&update_info[1].segment + lVar10 * 4 + uVar16 * 4);
          if (uVar21 <= uVar4) {
            sVar14 = sVar15 + lVar10;
            if (uVar21 != uVar4) {
              uVar16 = uVar16 + lVar10;
              goto LAB_010fbf72;
            }
            local_2838[lVar10 + sVar15] =
                 *(undefined1 *)((long)&update_info[1].segment + lVar10 + uVar16 + lVar1);
            local_2038[sVar15 + lVar10] = uVar4;
            uVar16 = uVar16 + 1 + lVar10;
            goto LAB_010fbfc4;
          }
          local_2838[lVar10 + sVar15] =
               *(undefined1 *)((long)&update_info[1].segment + lVar10 + uVar16 + lVar1);
          local_2038[sVar15 + lVar10] = uVar4;
          lVar10 = lVar10 + 1;
        } while ((uVar16 - uVar12) + lVar10 != 0);
        sVar14 = sVar15 + lVar10;
        uVar16 = uVar12;
      }
LAB_010fbf72:
      uVar19 = uVar18;
      if (uVar18 < uVar17) {
        do {
          uVar11 = (ulong)*(uint *)((long)&__dest_00->segment + uVar18 * 4);
          if (uVar21 <= uVar11) {
            uVar19 = uVar18;
            if (uVar21 == uVar11) {
              uVar22 = *(undefined1 *)((long)__dest + uVar18);
              goto LAB_010fbfb5;
            }
            break;
          }
          uVar18 = uVar18 + 1;
          uVar19 = uVar17;
        } while (uVar17 != uVar18);
      }
      uVar18 = uVar19;
      if (puVar6 == (unsigned_long *)0x0) {
        uVar22 = 1;
      }
      else {
        uVar22 = (puVar6[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0;
      }
LAB_010fbfb5:
      local_2838[sVar14] = uVar22;
      local_2038[sVar14] = (uint)uVar21;
LAB_010fbfc4:
      sVar15 = sVar14 + 1;
      uVar20 = uVar20 + 1;
    } while (uVar20 != count);
  }
  sVar14 = uVar12 - uVar16;
  if (uVar16 <= uVar12 && sVar14 != 0) {
    switchD_015df945::default
              (local_2838 + sVar15,(void *)((long)&update_info[1].segment + lVar1 + uVar16),sVar14);
    switchD_015df945::default
              (local_2038 + sVar15,(void *)((long)&update_info[1].segment + uVar16 * 4),sVar14 * 4);
    sVar15 = (uVar12 + sVar15) - uVar16;
  }
  update_info->N = (sel_t)sVar15;
  switchD_015df945::default
            ((void *)((long)&update_info[1].segment + (ulong)uVar3 * 4),local_2838,sVar15);
  switchD_015df945::default(update_info + 1,local_2038,sVar15 << 2);
  uVar16 = (ulong)base_info->N;
  psVar7 = sel->sel_vector;
  if (count == 0 || uVar16 == 0) {
    sVar15 = 0;
    uVar18 = 0;
    uVar12 = 0;
  }
  else {
    psVar8 = pSVar5->sel_vector;
    puVar6 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    sVar15 = 0;
    uVar12 = 0;
    uVar18 = 0;
    do {
      uVar17 = uVar12;
      if (psVar7 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar7[uVar12];
      }
      uVar20 = ids[uVar17] - lVar13;
      uVar3 = *(uint *)((long)&__dest_00->segment + uVar18 * 4);
      if (uVar20 == uVar3) {
        if (psVar8 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar8[uVar17];
        }
        if (puVar6 == (unsigned_long *)0x0) {
          bVar23 = true;
        }
        else {
          bVar23 = (puVar6[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0;
        }
        local_2838[sVar15] = bVar23;
        local_2038[sVar15] = (uint)uVar20;
        uVar12 = uVar12 + 1;
LAB_010fc16b:
        uVar18 = uVar18 + 1;
      }
      else {
        if (uVar3 <= uVar20) {
          local_2838[sVar15] = *(undefined1 *)((long)__dest + uVar18);
          local_2038[sVar15] = uVar3;
          goto LAB_010fc16b;
        }
        if (psVar8 != (sel_t *)0x0) {
          uVar17 = (ulong)psVar8[uVar17];
        }
        if (puVar6 == (unsigned_long *)0x0) {
          bVar23 = true;
        }
        else {
          bVar23 = (puVar6[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0;
        }
        local_2838[sVar15] = bVar23;
        local_2038[sVar15] = (uint)uVar20;
        uVar12 = uVar12 + 1;
      }
      sVar15 = sVar15 + 1;
    } while ((uVar12 < count) && (uVar18 < uVar16));
  }
  if (uVar12 < count) {
    psVar8 = pSVar5->sel_vector;
    puVar6 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    do {
      uVar17 = uVar12;
      if (psVar7 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar7[uVar12];
      }
      uVar20 = uVar17;
      if (psVar8 != (sel_t *)0x0) {
        uVar20 = (ulong)psVar8[uVar17];
      }
      if (puVar6 == (unsigned_long *)0x0) {
        bVar23 = true;
      }
      else {
        bVar23 = (puVar6[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0;
      }
      rVar9 = ids[uVar17];
      local_2838[sVar15] = bVar23;
      local_2038[sVar15] = (int)rVar9 - (int)lVar13;
      sVar15 = sVar15 + 1;
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  sVar14 = uVar16 - uVar18;
  if (uVar18 <= uVar16 && sVar14 != 0) {
    switchD_015df945::default
              (local_2838 + sVar15,(void *)((long)&base_info[1].segment + (ulong)uVar2 * 4 + uVar18)
               ,sVar14);
    switchD_015df945::default
              (local_2038 + sVar15,(void *)((long)&base_info[1].segment + uVar18 * 4),sVar14 * 4);
    sVar15 = sVar15 + sVar14;
  }
  base_info->N = (sel_t)sVar15;
  switchD_015df945::default(__dest,local_2838,sVar15);
  switchD_015df945::default(__dest_00,local_2038,sVar15 << 2);
  return;
}

Assistant:

static void MergeValidityLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                              UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto &base_validity = FlatVector::Validity(base_data);
	auto &update_validity = update.validity;
	MergeUpdateLoopInternal<bool, ValidityMask, ExtractValidityEntry>(base_info, &base_validity, update_info,
	                                                                  *update.sel, &update_validity, ids, count, sel);
}